

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O1

int AF_A_MageAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  AActor *actor;
  undefined8 *puVar3;
  AActor *pAVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  uint uVar9;
  VMValue *pVVar10;
  char *__assertion;
  bool bVar11;
  FSoundID local_44;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bff61;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    actor = (AActor *)(param->field_0).field_1.a;
    pVVar10 = param;
    uVar9 = numparam;
    if (actor != (AActor *)0x0) {
      if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
        (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pPVar8 = (actor->super_DThinker).super_DObject.Class;
      bVar11 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar9 = (uint)bVar11;
      pVVar10 = (VMValue *)(ulong)(pPVar8 == pPVar5 || bVar11);
      if (pPVar8 != pPVar5 && !bVar11) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar5) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005bff61;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005bff36;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar7 = (**(code **)*puVar3)(puVar3,pVVar10,uVar9,ret);
          puVar3[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar3[1];
        bVar11 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar5 && bVar11) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar11 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar5) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005bff61;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar4 = (actor->target).field_0.p;
      if (pAVar4 != (AActor *)0x0) {
        if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          dVar1 = (actor->Angles).Yaw.Degrees;
          local_30.Degrees = dVar1;
          MStaffSpawn2(actor,&local_30);
          local_38.Degrees = dVar1 + -5.0;
          MStaffSpawn2(actor,&local_38);
          local_40.Degrees = dVar1 + 5.0;
          MStaffSpawn2(actor,&local_40);
          local_44.ID = S_FindSound("MageStaffFire");
          S_Sound(actor,1,&local_44,1.0,1.0);
        }
        else {
          (actor->target).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005bff36:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005bff61:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_magestaff.cpp"
                ,0xfc,"int AF_A_MageAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MageAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (self->target == NULL)
	{
		return 0;
	}
	DAngle angle = self->Angles.Yaw;
	MStaffSpawn2(self, angle);
	MStaffSpawn2(self, angle - 5);
	MStaffSpawn2(self, angle + 5);
	S_Sound(self, CHAN_WEAPON, "MageStaffFire", 1, ATTN_NORM);
	return 0;
}